

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.cpp
# Opt level: O3

void __thiscall OpenMD::TorsionStamp::validate(TorsionStamp *this)

{
  int iVar1;
  pointer pcVar2;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->GhostVectorSource).super_ParameterBase.empty_ == false) {
    isNonNegative();
    iVar1 = *(int *)&(this->GhostVectorSource).super_ParameterBase.field_0x2c;
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    if (iVar1 < 0) {
      pcVar2 = (this->GhostVectorSource).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,local_40,local_38 + (long)local_40);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_60[0]);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void TorsionStamp::validate() {
    DataHolder::validate();
    CheckParameter(GhostVectorSource, isNonNegative());
  }